

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltexceptions.h
# Opt level: O2

void __thiscall bad_vulkan_alloc::bad_vulkan_alloc(bad_vulkan_alloc *this,int which,char *_message)

{
  ostream *poVar1;
  string memtype;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  *(undefined ***)this = &PTR__bad_vulkan_alloc_00185bd0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->message);
  (this->_what)._M_dataplus._M_p = (pointer)&(this->_what).field_2;
  (this->_what)._M_string_length = 0;
  (this->_what).field_2._M_local_buf[0] = '\0';
  if (which == -0xc) {
    poVar1 = std::operator<<((ostream *)&this->field_0x18,"Pool fragmented when allocating for ");
    poVar1 = std::operator<<(poVar1,_message);
    std::operator<<(poVar1,".");
  }
  else {
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    if (((which == -0x3b9bd788) || (which == -2)) || (which == -1)) {
      std::__cxx11::string::assign((char *)&local_48);
    }
    poVar1 = std::operator<<((ostream *)&this->field_0x18,"Out of ");
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    poVar1 = std::operator<<(poVar1," memory for ");
    poVar1 = std::operator<<(poVar1,_message);
    std::operator<<(poVar1,".");
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_what,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

bad_vulkan_alloc(int which, const char* _message) : std::bad_alloc() {
        if (which == FRAGMENTED_POOL) {
            message << "Pool fragmented when allocating for " << _message << ".";
        } else {
          std::string memtype;
            switch (which) {
              case OUT_OF_HOST_MEMORY: memtype = "host"; break;
              case OUT_OF_DEVICE_MEMORY: memtype = "device"; break;
              case OUT_OF_POOL_MEMORY: memtype = "pool"; break;
              default: break;
            }
            message << "Out of " << memtype << " memory for " << _message << ".";
        }
        _what = message.str();
    }